

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

Json __thiscall
json11::anon_unknown_22::JsonParser::expect(JsonParser *this,string *expected,Json *res)

{
  size_t sVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 *in_RCX;
  ulong *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ulong uVar7;
  Json JVar8;
  long *local_a0;
  long local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  if (expected->_M_string_length == 0) {
    __assert_fail("i != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/json11/json11.cpp"
                  ,0x276,
                  "Json json11::(anonymous namespace)::JsonParser::expect(const string &, Json)");
  }
  uVar7 = expected->_M_string_length - 1;
  expected->_M_string_length = uVar7;
  iVar2 = std::__cxx11::string::compare
                    ((ulong)(expected->_M_dataplus)._M_p,uVar7,
                     (string *)
                     (res->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (iVar2 == 0) {
    expected->_M_string_length =
         (long)&((res->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base + expected->_M_string_length;
    this->str = (string *)*in_RCX;
    this->i = 0;
    sVar1 = in_RCX[1];
    in_RCX[1] = 0;
    this->i = sVar1;
    *in_RCX = 0;
    _Var6._M_pi = extraout_RDX;
    goto LAB_0017e01b;
  }
  std::operator+(&local_40,"parse error: expected ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)res);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_70 = *puVar5;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar5;
    local_80 = (ulong *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_60,(ulong)(expected->_M_dataplus)._M_p);
  uVar7 = 0xf;
  if (local_80 != &local_70) {
    uVar7 = local_70;
  }
  if (uVar7 < (ulong)(local_58 + local_78)) {
    uVar7 = 0xf;
    if (local_60 != local_50) {
      uVar7 = local_50[0];
    }
    if (uVar7 < (ulong)(local_58 + local_78)) goto LAB_0017df3d;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
  }
  else {
LAB_0017df3d:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60);
  }
  local_a0 = &local_90;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_90 = *plVar3;
    uStack_88 = puVar4[3];
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*puVar4;
  }
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  JVar8 = fail(this,expected);
  _Var6._M_pi = JVar8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
    _Var6._M_pi = extraout_RDX_01;
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
    _Var6._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var6._M_pi = extraout_RDX_03;
  }
LAB_0017e01b:
  JVar8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  JVar8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json expect(const string &expected, Json res) {
        assert(i != 0);
        i--;
        if (str.compare(i, expected.length(), expected) == 0) {
            i += expected.length();
            return res;
        } else {
            return fail("parse error: expected " + expected + ", got " + str.substr(i, expected.length()));
        }
    }